

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

Interpolations *
testing::internal::ValidateMatcherDescription
          (Interpolations *__return_storage_ptr__,char **param_names,char *description)

{
  internal *__beg;
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  internal *in_RCX;
  allocator<char> *__a;
  AssertHelper local_150;
  string local_148;
  Message local_128;
  char local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  string local_e8;
  Message local_c8;
  uint local_c0;
  allocator<char> local_b9;
  int param_index;
  string param_name;
  internal *local_90;
  string local_88;
  Message local_68;
  char *local_60;
  char *q;
  Interpolation local_48;
  internal *local_30;
  char *p;
  internal *local_20;
  char *description_local;
  char **param_names_local;
  Interpolations *interps;
  
  p._7_1_ = 0;
  local_20 = (internal *)description;
  description_local = (char *)param_names;
  param_names_local = (char **)__return_storage_ptr__;
  std::vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>::
  vector(__return_storage_ptr__);
  local_30 = local_20;
  while (*local_30 != (internal)0x0) {
    bVar1 = SkipPrefix("%%",(char **)&local_30);
    if (bVar1) {
      in_RCX = (internal *)0xfffffffe;
      Interpolation::Interpolation(&local_48,(char *)(local_30 + -2),(char *)local_30,-2);
      std::
      vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>::
      push_back(__return_storage_ptr__,&local_48);
    }
    else {
      bVar1 = SkipPrefix("%(",(char **)&local_30);
      if (bVar1) {
        pcVar3 = strstr((char *)local_30,")s");
        __beg = local_30;
        local_60 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          Message::Message(&local_68);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_
                    (&local_88,local_20,(char *)(local_30 + -2),(char *)in_RCX);
          pMVar2 = Message::operator<<(&local_68,&local_88);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [38])
                                              "an interpolation must end with \")s\", ");
          pMVar2 = Message::operator<<(pMVar2,(char (*) [6])"but \"");
          local_90 = local_30 + -2;
          pMVar2 = Message::operator<<(pMVar2,(char **)&local_90);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [12])"\" does not.");
          in_RCX = (internal *)0x2317;
          AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&param_name.field_2 + 8),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,0x2317,"Failed");
          AssertHelper::operator=((AssertHelper *)((long)&param_name.field_2 + 8),pMVar2);
          AssertHelper::~AssertHelper((AssertHelper *)((long)&param_name.field_2 + 8));
          std::__cxx11::string::~string((string *)&local_88);
          Message::~Message(&local_68);
        }
        else {
          __a = &local_b9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&param_index,(char *)__beg,pcVar3,__a);
          std::allocator<char>::~allocator(&local_b9);
          local_c0 = GetParamIndex((char **)description_local,(string *)&param_index);
          if (local_c0 == 0xfffffffd) {
            Message::Message(&local_c8);
            FormatMatcherDescriptionSyntaxError_abi_cxx11_
                      (&local_e8,local_20,(char *)local_30,(char *)__a);
            pMVar2 = Message::operator<<(&local_c8,&local_e8);
            pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x206dff);
            pMVar2 = Message::operator<<(pMVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&param_index);
            pMVar2 = Message::operator<<(pMVar2,(char (*) [32])"\" is an invalid parameter name.");
            in_RCX = (internal *)0x231e;
            AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,0x231e,"Failed");
            AssertHelper::operator=(&local_f0,pMVar2);
            AssertHelper::~AssertHelper(&local_f0);
            std::__cxx11::string::~string((string *)&local_e8);
            Message::~Message(&local_c8);
          }
          else {
            in_RCX = (internal *)(ulong)local_c0;
            Interpolation::Interpolation
                      ((Interpolation *)&gtest_ar.message_,(char *)(local_30 + -2),local_60 + 2,
                       local_c0);
            std::
            vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
            ::push_back(__return_storage_ptr__,(value_type *)&gtest_ar.message_);
            local_30 = (internal *)(local_60 + 2);
          }
          std::__cxx11::string::~string((string *)&param_index);
        }
      }
      else {
        local_119 = '%';
        in_RCX = local_30;
        CmpHelperNE<char,char>((internal *)local_118,"*p","\'%\'",(char *)local_30,&local_119);
        bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          Message::Message(&local_128);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_
                    (&local_148,local_20,(char *)local_30,(char *)in_RCX);
          pMVar2 = Message::operator<<(&local_128,&local_148);
          pMVar2 = Message::operator<<(pMVar2,(char (*) [38])
                                              "use \"%%\" instead of \"%\" to print \"%\".");
          pcVar3 = AssertionResult::failure_message((AssertionResult *)local_118);
          in_RCX = (internal *)0x2327;
          AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,8999,pcVar3);
          AssertHelper::operator=(&local_150,pMVar2);
          AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&local_148);
          Message::~Message(&local_128);
        }
        AssertionResult::~AssertionResult((AssertionResult *)local_118);
        local_30 = local_30 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interpolations ValidateMatcherDescription(
    const char* param_names[], const char* description) {
  Interpolations interps;
  for (const char* p = description; *p != '\0';) {
    if (SkipPrefix("%%", &p)) {
      interps.push_back(Interpolation(p - 2, p, kPercentInterpolation));
    } else if (SkipPrefix("%(", &p)) {
      const char* const q = strstr(p, ")s");
      if (q == NULL) {
        // TODO(wan@google.com): change the source file location in
        // the failure to point to where the MATCHER*() macro is used.
        ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p - 2)
                      << "an interpolation must end with \")s\", "
                      << "but \"" << (p - 2) << "\" does not.";
      } else {
        const string param_name(p, q);
        const int param_index = GetParamIndex(param_names, param_name);
        if (param_index == kInvalidInterpolation) {
          ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p)
                        << "\"" << param_name
                        << "\" is an invalid parameter name.";
        } else {
          interps.push_back(Interpolation(p - 2, q + 2, param_index));
          p = q + 2;
        }
      }
    } else {
      EXPECT_NE(*p, '%') << FormatMatcherDescriptionSyntaxError(description, p)
                         << "use \"%%\" instead of \"%\" to print \"%\".";
      ++p;
    }
  }
  return interps;
}